

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalPiecewiseMergeJoin::ResolveSimpleJoin
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,DataChunk *input,
          DataChunk *chunk,OperatorState *state_p)

{
  OperatorState *this_00;
  bool bVar1;
  char cVar2;
  idx_t iVar3;
  __int_type _Var4;
  pointer pVVar5;
  unsigned_long *__s;
  byte bVar6;
  int iVar7;
  int iVar8;
  pointer pGVar9;
  type pLVar10;
  const_reference pvVar11;
  type state;
  pointer pGVar12;
  reference pvVar13;
  pointer pLVar14;
  reference this_01;
  type pRVar15;
  NotImplementedException *this_02;
  DataChunk *pDVar16;
  Vector *key;
  ulong uVar17;
  pointer this_03;
  ulong uVar18;
  idx_t iVar19;
  bool external;
  data_ptr_t l_ptr;
  SBScanState lread;
  SBScanState rread;
  bool found_match [2048];
  bool local_9e9;
  DataChunk *local_9e8;
  type local_9e0;
  DataChunk *local_9d8;
  DataChunk *local_9d0;
  idx_t local_9c8;
  ulong local_9c0;
  data_ptr_t local_9b8;
  int local_9ac;
  pointer local_9a8;
  data_ptr_t local_9a0;
  idx_t local_998;
  PhysicalPiecewiseMergeJoin *local_990;
  SBScanState local_988;
  SBScanState local_8e0;
  bool local_838 [2056];
  
  local_9d8 = chunk;
  pGVar9 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  PiecewiseMergeJoinState::ResolveJoinKeys((PiecewiseMergeJoinState *)state_p,input);
  this_00 = state_p + 0x21;
  pLVar10 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
            ::operator*((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                         *)this_00);
  switchD_012e5a64::default(local_838,0,0x800);
  local_990 = this;
  pvVar11 = vector<duckdb::JoinCondition,_true>::operator[]
                      (&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions,0);
  local_9ac = MergeJoinComparisonValue(pvVar11->comparison);
  state = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
          operator*((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                     *)(state_p + 0x22));
  pGVar12 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
            ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                          *)(pGVar9 + 1));
  bVar1 = (state->sort_layout).all_constant;
  local_9e9 = state->external;
  SBScanState::SBScanState(&local_988,state->buffer_manager,state);
  local_9e0 = state;
  pvVar13 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::operator[](&state->sorted_blocks,0);
  local_988.sb = (pvVar13->
                 super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                 .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
  pLVar14 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
            ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                          *)this_00);
  iVar3 = pLVar14->count;
  pLVar14 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
            ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                          *)this_00);
  iVar19 = pLVar14->has_null;
  MergeJoinPinSortingBlock(&local_988,0);
  local_988.entry_idx = 0;
  local_9c0 = iVar3 - iVar19;
  local_9b8 = SBScanState::RadixPtr(&local_988);
  local_9d0 = (DataChunk *)state_p;
  SBScanState::SBScanState
            (&local_8e0,(pGVar12->global_sort_state).buffer_manager,&pGVar12->global_sort_state);
  local_9a8 = pGVar9 + 1;
  pvVar13 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::operator[](&(pGVar12->global_sort_state).sorted_blocks,0);
  local_8e0.sb = (pvVar13->
                 super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                 .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
  if (*(pointer *)((long)&(local_8e0.sb)->radix_sorting_data + 8) !=
      *(pointer *)&(local_8e0.sb)->radix_sorting_data) {
    local_9c8 = (local_9e0->sort_layout).comparison_size;
    iVar3 = (local_9e0->sort_layout).entry_size;
    iVar19 = 0;
    local_9e8 = (DataChunk *)0x0;
    uVar17 = 0;
    local_9e0 = (type)&local_9e0->sort_layout;
    while( true ) {
      MergeJoinPinSortingBlock(&local_8e0,iVar19);
      local_998 = iVar19;
      this_01 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                ::operator[](&(local_8e0.sb)->radix_sorting_data,iVar19);
      pGVar9 = local_9a8;
      pRVar15 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator*(this_01);
      iVar19 = pRVar15->count;
      pGVar12 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                              *)pGVar9);
      _Var4 = (pGVar12->count).super___atomic_base<unsigned_long>._M_i;
      pGVar12 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                              *)pGVar9);
      pDVar16 = (DataChunk *)(_Var4 - (pGVar12->has_null).super___atomic_base<unsigned_long>._M_i);
      uVar18 = iVar19 + (long)local_9e8;
      if (pDVar16 < local_9e8) {
        pDVar16 = local_9e8;
      }
      if (uVar18 < pDVar16) {
        pDVar16 = (DataChunk *)uVar18;
      }
      if (pDVar16 == local_9e8) break;
      uVar18 = ~(ulong)local_9e8;
      local_9e8 = (DataChunk *)((long)local_9e8 + pRVar15->count);
      local_8e0.entry_idx = (long)pDVar16 + uVar18;
      local_9a0 = SBScanState::RadixPtr(&local_8e0);
      iVar7 = local_9ac;
      while( true ) {
        if (bVar1 == false) {
          local_988.entry_idx = uVar17;
          local_8e0.entry_idx = (long)pDVar16 + uVar18;
          iVar8 = Comparators::CompareTuple
                            (&local_988,&local_8e0,&local_9b8,&local_9a0,(SortLayout *)local_9e0,
                             &local_9e9);
        }
        else {
          iVar8 = FastMemcmp(local_9b8,local_9a0,local_9c8);
        }
        if (iVar7 < iVar8) break;
        local_838[uVar17] = true;
        uVar17 = uVar17 + 1;
        local_9b8 = local_9b8 + iVar3;
        if (local_9c0 <= uVar17) goto LAB_0154e512;
      }
      iVar19 = local_998 + 1;
      if ((ulong)((long)*(pointer *)
                         ((long)&((local_8e0.sb)->radix_sorting_data).
                                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data + 8) -
                  *(long *)&((local_8e0.sb)->radix_sorting_data).
                            super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                            ._M_impl.super__Vector_impl_data >> 3) <= iVar19) break;
    }
  }
LAB_0154e512:
  BufferHandle::~BufferHandle(&local_8e0.payload_heap_handle);
  BufferHandle::~BufferHandle(&local_8e0.payload_data_handle);
  BufferHandle::~BufferHandle(&local_8e0.blob_sorting_heap_handle);
  BufferHandle::~BufferHandle(&local_8e0.blob_sorting_data_handle);
  BufferHandle::~BufferHandle(&local_8e0.radix_handle);
  BufferHandle::~BufferHandle(&local_988.payload_heap_handle);
  BufferHandle::~BufferHandle(&local_988.payload_data_handle);
  BufferHandle::~BufferHandle(&local_988.blob_sorting_heap_handle);
  BufferHandle::~BufferHandle(&local_988.blob_sorting_data_handle);
  BufferHandle::~BufferHandle(&local_988.radix_handle);
  pDVar16 = (DataChunk *)((long)local_9d0 + 0x40);
  cVar2 = (local_990->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
          super_CachingPhysicalOperator.field_0x81;
  if (cVar2 == '\x05') {
    PhysicalJoin::ConstructSemiJoinResult(pDVar16,local_9d8,local_838);
  }
  else if (cVar2 == '\x06') {
    PhysicalJoin::ConstructAntiJoinResult(pDVar16,local_9d8,local_838);
  }
  else {
    local_9d0 = pDVar16;
    if (cVar2 != '\a') {
      this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_988.buffer_manager = (BufferManager *)&local_988.state;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_988,"Unimplemented join type for merge join","");
      NotImplementedException::NotImplementedException(this_02,(string *)&local_988);
      __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_9e8 = &pLVar10->keys;
    this_03 = (pLVar10->keys).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar5 = (pLVar10->keys).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_03 != pVVar5) {
      uVar17 = pLVar10->count - pLVar10->has_null;
      local_9c0 = uVar17 + 0x3f >> 6;
      local_9e0 = (type)(local_9c0 - 1);
      local_9c8 = local_9c0 * 8 - 8;
      do {
        Vector::Flatten(this_03,(pLVar10->keys).count);
        FlatVector::VerifyFlatVector(this_03);
        __s = (this_03->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (__s != (unsigned_long *)0x0) {
          if (uVar17 != 0) {
            if (local_9e0 != (type)0x0) {
              switchD_012e5a64::default(__s,0xff,local_9c8);
            }
            __s[local_9c0 - 1] =
                 __s[local_9c0 - 1] |
                 -(ulong)((uVar17 & 0x3f) == 0) | ~(-1L << ((byte)uVar17 & 0x3f));
          }
          uVar18 = uVar17;
          if (uVar17 < pLVar10->count) {
            do {
              bVar6 = (byte)uVar18 & 0x3f;
              __s[uVar18 >> 6] =
                   __s[uVar18 >> 6] & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
              uVar18 = uVar18 + 1;
            } while (uVar18 < pLVar10->count);
          }
        }
        this_03 = this_03 + 1;
      } while (this_03 != pVVar5);
    }
    pGVar12 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                            *)local_9a8);
    PhysicalJoin::ConstructMarkJoinResult
              (local_9e8,local_9d0,local_9d8,local_838,
               (pGVar12->has_null).super___atomic_base<unsigned_long>._M_i != 0);
  }
  return;
}

Assistant:

void PhysicalPiecewiseMergeJoin::ResolveSimpleJoin(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                   OperatorState &state_p) const {
	auto &state = state_p.Cast<PiecewiseMergeJoinState>();
	auto &gstate = sink_state->Cast<MergeJoinGlobalState>();

	state.ResolveJoinKeys(input);
	auto &lhs_table = *state.lhs_local_table;

	// perform the actual join
	bool found_match[STANDARD_VECTOR_SIZE];
	memset(found_match, 0, sizeof(found_match));
	MergeJoinSimpleBlocks(state, gstate, found_match, conditions[0].comparison);

	// use the sorted payload
	const auto lhs_not_null = lhs_table.count - lhs_table.has_null;
	auto &payload = state.lhs_payload;

	// now construct the result based on the join result
	switch (join_type) {
	case JoinType::MARK: {
		// The only part of the join keys that is actually used is the validity mask.
		// Since the payload is sorted, we can just set the tail end of the validity masks to invalid.
		for (auto &key : lhs_table.keys.data) {
			key.Flatten(lhs_table.keys.size());
			auto &mask = FlatVector::Validity(key);
			if (mask.AllValid()) {
				continue;
			}
			mask.SetAllValid(lhs_not_null);
			for (idx_t i = lhs_not_null; i < lhs_table.count; ++i) {
				mask.SetInvalid(i);
			}
		}
		// So we make a set of keys that have the validity mask set for the
		PhysicalJoin::ConstructMarkJoinResult(lhs_table.keys, payload, chunk, found_match, gstate.table->has_null);
		break;
	}
	case JoinType::SEMI:
		PhysicalJoin::ConstructSemiJoinResult(payload, chunk, found_match);
		break;
	case JoinType::ANTI:
		PhysicalJoin::ConstructAntiJoinResult(payload, chunk, found_match);
		break;
	default:
		throw NotImplementedException("Unimplemented join type for merge join");
	}
}